

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O0

SCREENSHOT * create_screenshot(char *name,char *ext)

{
  SCREENSHOT *pSVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  SCREENSHOT *ret;
  SCREENSHOT *in_stack_00000020;
  
  pSVar1 = (SCREENSHOT *)malloc(0x18);
  pcVar2 = strdup(in_RDI);
  pSVar1->name = pcVar2;
  pcVar2 = strdup(in_RSI);
  pSVar1->ext = pcVar2;
  pSVar1->counter = -1;
  next_screenshot(in_stack_00000020);
  return pSVar1;
}

Assistant:

SCREENSHOT *create_screenshot(char *name, char *ext)
{
   SCREENSHOT *ret = (SCREENSHOT *) malloc(sizeof(SCREENSHOT));

   ret->name = strdup(name);
   ret->ext = strdup(ext);
   ret->counter = -1;
   next_screenshot(ret);

   return ret;
}